

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

MemberSyntax * __thiscall slang::parsing::Parser::parseCoverageMember(Parser *this)

{
  Token colon;
  Token colon_00;
  Token name_00;
  Token name_01;
  span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> elements;
  Token semi;
  AttrList attributes_00;
  bool bVar1;
  undefined8 *in_RDI;
  Token TVar2;
  Parser *in_stack_00000030;
  undefined6 in_stack_000000c0;
  TokenKind in_stack_000000c6;
  BumpAllocator *in_stack_000000c8;
  SourceLocation in_stack_000000d0;
  undefined1 in_stack_000000d8 [16];
  NamedLabelSyntax *label_1;
  Token name_1;
  DataTypeSyntax *type;
  Parser *in_stack_00000170;
  bitmask<slang::parsing::detail::TypeOptions> in_stack_0000017c;
  NamedLabelSyntax *label;
  Token name;
  Token token;
  CoverageOptionSyntax *option;
  AttrList attributes;
  NamedLabelSyntax *in_stack_00000310;
  Parser *in_stack_00000318;
  AttrList in_stack_00000320;
  ParserBase *in_stack_fffffffffffffdf8;
  ParserBase *this_00;
  undefined4 in_stack_fffffffffffffe00;
  uint32_t in_stack_fffffffffffffe04;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *this_01;
  undefined6 in_stack_fffffffffffffe08;
  TokenKind in_stack_fffffffffffffe0e;
  TokenKind TVar3;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffe10;
  Info *pIVar4;
  undefined7 in_stack_fffffffffffffe20;
  undefined1 uVar5;
  Token local_1d0;
  SourceLocation local_1c0;
  Token local_1b8;
  TokenKind in_stack_fffffffffffffe8e;
  ParserBase *in_stack_fffffffffffffe90;
  Parser *in_stack_fffffffffffffed8;
  pointer in_stack_fffffffffffffee0;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffee8;
  bitmask<slang::parsing::detail::TypeOptions> local_bc;
  DataTypeSyntax *local_b8;
  pointer local_b0;
  size_t local_a8;
  pointer local_a0;
  size_t local_98;
  Token local_90;
  undefined8 local_80;
  Info *local_78;
  NamedLabelSyntax *local_70;
  Token local_68;
  Token local_58;
  Token local_48;
  pointer local_38;
  size_t local_30;
  CoverCrossSyntax *local_28;
  AttrList local_20;
  CoverCrossSyntax *local_8;
  
  local_20 = parseAttributes(in_stack_00000030);
  local_38 = local_20._M_ptr;
  local_30 = local_20._M_extent._M_extent_value;
  attributes_00._M_extent._M_extent_value = in_stack_fffffffffffffee8._M_extent_value;
  attributes_00._M_ptr = in_stack_fffffffffffffee0;
  local_28 = (CoverCrossSyntax *)parseCoverageOption(in_stack_fffffffffffffed8,attributes_00);
  local_8 = local_28;
  if (local_28 == (CoverCrossSyntax *)0x0) {
    local_48 = ParserBase::peek(in_stack_fffffffffffffdf8);
    uVar5 = false;
    if (local_48.kind == Identifier) {
      local_58 = ParserBase::peek((ParserBase *)
                                  CONCAT26(in_stack_fffffffffffffe0e,in_stack_fffffffffffffe08),
                                  in_stack_fffffffffffffe04);
      uVar5 = local_58.kind == Colon;
    }
    if ((bool)uVar5 == false) {
      bVar1 = slang::syntax::SyntaxFacts::isPossibleDataType(local_48.kind);
      if (bVar1) {
        bitmask<slang::parsing::detail::TypeOptions>::bitmask(&local_bc,AllowImplicit);
        local_b8 = parseDataType(in_stack_00000170,in_stack_0000017c);
        ParserBase::expect(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8e);
        pIVar4 = (Info *)(in_RDI + 0x1c);
        ParserBase::expect(in_stack_fffffffffffffe90,in_stack_fffffffffffffe8e);
        name_01.rawLen._2_2_ = in_stack_fffffffffffffe0e;
        name_01._0_6_ = in_stack_fffffffffffffe08;
        name_01.info = pIVar4;
        colon_00.info._0_4_ = in_stack_fffffffffffffe00;
        colon_00._0_8_ = in_stack_fffffffffffffdf8;
        colon_00.info._4_4_ = in_stack_fffffffffffffe04;
        slang::syntax::SyntaxFactory::namedLabel((SyntaxFactory *)0x6d178c,name_01,colon_00);
        local_8 = (CoverCrossSyntax *)
                  parseCoverpoint((Parser *)in_stack_000000d0,(AttrList)in_stack_000000d8,
                                  (DataTypeSyntax *)in_stack_000000c8,
                                  (NamedLabelSyntax *)CONCAT26(in_stack_000000c6,in_stack_000000c0))
        ;
      }
      else if (local_48.kind == CoverPointKeyword) {
        local_8 = (CoverCrossSyntax *)
                  parseCoverpoint((Parser *)in_stack_000000d0,(AttrList)in_stack_000000d8,
                                  (DataTypeSyntax *)in_stack_000000c8,
                                  (NamedLabelSyntax *)CONCAT26(in_stack_000000c6,in_stack_000000c0))
        ;
      }
      else if (local_48.kind == CrossKeyword) {
        local_8 = parseCoverCross(in_stack_00000318,in_stack_00000320,in_stack_00000310);
      }
      else {
        TVar3 = local_48.kind;
        bVar1 = std::span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>::empty
                          ((span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL> *
                           )0x6d18c1);
        if (bVar1) {
          local_8 = (CoverCrossSyntax *)0x0;
        }
        else {
          this_01 = (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)(in_RDI + 0x1c);
          elements._M_ptr._6_2_ = TVar3;
          elements._M_ptr._0_6_ = in_stack_fffffffffffffe08;
          elements._M_extent._M_extent_value = in_stack_fffffffffffffe10._M_extent_value;
          slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>::SyntaxList
                    (this_01,elements);
          slang::syntax::TokenList::TokenList
                    ((TokenList *)in_stack_fffffffffffffe10._M_extent_value,
                     (nullptr_t)CONCAT26(TVar3,in_stack_fffffffffffffe08));
          this_00 = (ParserBase *)*in_RDI;
          local_1d0 = ParserBase::peek(this_00);
          local_1c0 = Token::location(&local_1d0);
          local_1b8 = Token::createMissing(in_stack_000000c8,in_stack_000000c6,in_stack_000000d0);
          semi.rawLen._2_2_ = TVar3;
          semi._0_6_ = in_stack_fffffffffffffe08;
          semi.info = (Info *)in_stack_fffffffffffffe10._M_extent_value;
          local_8 = (CoverCrossSyntax *)
                    slang::syntax::SyntaxFactory::emptyMember
                              ((SyntaxFactory *)this_01,
                               (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)this_00,
                               (TokenList *)0x6d198c,semi);
        }
      }
    }
    else {
      TVar2 = ParserBase::consume((ParserBase *)CONCAT17(uVar5,in_stack_fffffffffffffe20));
      local_68._0_8_ = TVar2._0_8_;
      local_80._0_2_ = local_68.kind;
      local_80._2_1_ = local_68._2_1_;
      local_80._3_1_ = local_68.numFlags.raw;
      local_80._4_4_ = local_68.rawLen;
      local_68.info = TVar2.info;
      local_78 = local_68.info;
      local_68 = TVar2;
      local_90 = ParserBase::consume((ParserBase *)CONCAT17(uVar5,in_stack_fffffffffffffe20));
      name_00.rawLen._2_2_ = in_stack_fffffffffffffe0e;
      name_00._0_6_ = in_stack_fffffffffffffe08;
      name_00.info = (Info *)in_stack_fffffffffffffe10._M_extent_value;
      colon.info._0_4_ = in_stack_fffffffffffffe00;
      colon._0_8_ = in_stack_fffffffffffffdf8;
      colon.info._4_4_ = in_stack_fffffffffffffe04;
      local_70 = slang::syntax::SyntaxFactory::namedLabel((SyntaxFactory *)0x6d15f6,name_00,colon);
      bVar1 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffe10._M_extent_value,
                               in_stack_fffffffffffffe0e);
      if (bVar1) {
        local_a0 = local_20._M_ptr;
        local_98 = local_20._M_extent._M_extent_value;
        local_8 = parseCoverCross(in_stack_00000318,in_stack_00000320,in_stack_00000310);
      }
      else {
        local_b0 = local_20._M_ptr;
        local_a8 = local_20._M_extent._M_extent_value;
        local_8 = (CoverCrossSyntax *)
                  parseCoverpoint((Parser *)in_stack_000000d0,(AttrList)in_stack_000000d8,
                                  (DataTypeSyntax *)in_stack_000000c8,
                                  (NamedLabelSyntax *)CONCAT26(in_stack_000000c6,in_stack_000000c0))
        ;
      }
    }
  }
  return &local_8->super_MemberSyntax;
}

Assistant:

MemberSyntax* Parser::parseCoverageMember() {
    auto attributes = parseAttributes();

    // check for coverage option
    auto option = parseCoverageOption(attributes);
    if (option)
        return option;

    auto token = peek();
    if (token.kind == TokenKind::Identifier && peek(1).kind == TokenKind::Colon) {
        auto name = consume();
        auto& label = factory.namedLabel(name, consume());
        if (peek(TokenKind::CrossKeyword))
            return parseCoverCross(attributes, &label);
        else
            return parseCoverpoint(attributes, nullptr, &label);
    }

    if (isPossibleDataType(token.kind)) {
        auto& type = parseDataType(TypeOptions::AllowImplicit);
        auto name = expect(TokenKind::Identifier);
        auto& label = factory.namedLabel(name, expect(TokenKind::Colon));
        return parseCoverpoint(attributes, &type, &label);
    }

    switch (token.kind) {
        case TokenKind::CoverPointKeyword:
            return parseCoverpoint(attributes, nullptr, nullptr);
        case TokenKind::CrossKeyword:
            return parseCoverCross(attributes, nullptr);
        default:
            break;
    }

    // if we got attributes but don't know what comes next, we have some kind of nonsense
    if (!attributes.empty()) {
        return &factory.emptyMember(attributes, nullptr,
                                    Token::createMissing(alloc, TokenKind::Semicolon,
                                                         peek().location()));
    }

    // otherwise, we got nothing and should just return null so that our caller will skip and try
    // again.
    return nullptr;
}